

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::PragmaInstr::Dump(PragmaInstr *this,IRDumpFlags flags)

{
  JITTimeFunctionBody *this_00;
  FunctionBody *this_01;
  
  if ((DAT_015ada8b == '\x01') && ((this->super_Instr).m_opcode == StatementBoundary)) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(((this->super_Instr).m_func)->m_workItem);
    this_01 = (FunctionBody *)JITTimeFunctionBody::GetAddr(this_00);
    if ((this_01 != (FunctionBody *)0x0) &&
       ((((this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
         field_0xa8 & 4) == 0)) {
      Js::FunctionBody::PrintStatementSourceLine(this_01,this->m_statementIndex);
    }
  }
  Instr::Dump(&this->super_Instr,flags);
  return;
}

Assistant:

void
PragmaInstr::Dump(IRDumpFlags flags)
{
    if (Js::Configuration::Global.flags.PrintSrcInDump && this->m_opcode == Js::OpCode::StatementBoundary)
    {
        Js::FunctionBody * functionBody = nullptr;
        if (!m_func->IsOOPJIT())
        {
            functionBody = ((Js::FunctionBody*)m_func->GetJITFunctionBody()->GetAddr());
        }
        if (functionBody && !functionBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            functionBody->PrintStatementSourceLine(this->m_statementIndex);
        }
    }
    __super::Dump(flags);
}